

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O2

bool duckdb::TryDecimalStringCast<short,(char)44>
               (char *string_ptr,idx_t string_size,short *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  uint params_2;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  DecimalCastData<short> local_e4;
  ulong local_d8;
  allocator local_c9;
  char *local_c8;
  undefined4 local_c0;
  uint local_bc;
  ulong local_b8;
  ExponentData exponent;
  string_t value;
  string local_70;
  string local_50 [32];
  
  params_2 = CONCAT31(in_register_00000089,scale);
  local_e4.result = 0;
  local_e4.digit_count = '\0';
  local_e4.decimal_count = '\0';
  local_e4.round_set = false;
  local_e4.should_round = false;
  local_c0 = (undefined4)CONCAT71(in_register_00000081,width);
  local_e4.excessive_decimals = '\0';
  local_e4.exponent_type = NONE;
  local_e4.limit =
       *(StoreType *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000081,width) & 0xffffffff) * 8);
  for (uVar8 = 0; uVar6 = string_size - uVar8, local_e4.width = width, local_e4.scale = scale,
      local_bc = params_2, uVar6 != 0; uVar8 = uVar8 + 1) {
    bVar2 = string_ptr[uVar8];
    if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
      if (bVar2 == 0x2d) {
        uVar7 = string_size - uVar8;
        uVar6 = 1;
        goto LAB_01289fe9;
      }
      if (bVar2 != 0x30 || string_size - 1 == uVar8) {
LAB_0128a0c4:
        local_d8 = (ulong)(bVar2 == 0x2b);
        uVar7 = local_d8;
        goto LAB_0128a0d3;
      }
      bVar1 = (bool)string_ptr[uVar8 + 1];
      if (bVar1 != true) {
        if (bVar1 != true) {
          if (bVar1 == true) goto LAB_0128a219;
          if (bVar1 != true) goto LAB_0128a0c4;
        }
        bVar1 = IntegerHexCastLoop<duckdb::DecimalCastData<short>,false,false,duckdb::DecimalCastOperation>
                          (string_ptr + uVar8 + 1,~uVar8 + string_size,&local_e4,bVar1);
        goto LAB_0128a0b7;
      }
LAB_0128a219:
      if (0xfffffffffffffffd < (string_size - uVar8) - 3) {
        DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_e4);
      }
      break;
    }
  }
  goto LAB_0128a543;
  while( true ) {
    bVar2 = string_ptr[uVar8 + uVar4];
    if (9 < (byte)(bVar2 - 0x30)) {
      if (bVar2 != 0x2c) goto LAB_0128a316;
      local_d8 = uVar4 + 1;
      uVar6 = local_d8;
      goto LAB_0128a187;
    }
    bVar1 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<short>,true>
                      (&local_e4,bVar2 - 0x30);
    if ((!bVar1) ||
       (((uVar6 = uVar7, ~uVar4 + string_size != uVar8 &&
         (uVar6 = uVar4 + 1, string_ptr[uVar8 + 1 + uVar4] == '_')) &&
        (((string_size - uVar4) - 2 == uVar8 ||
         (uVar6 = uVar4 + 2, 9 < (byte)(string_ptr[uVar8 + 2 + uVar4] - 0x30U))))))) break;
LAB_01289fe9:
    uVar4 = uVar6;
    if (uVar7 <= uVar4) goto LAB_0128a155;
  }
  goto LAB_0128a543;
LAB_0128a187:
  uVar3 = uVar6;
  if (uVar7 <= uVar3) {
    bVar1 = 1 < uVar4;
    uVar4 = uVar3;
    if (local_d8 < uVar3 || bVar1) goto LAB_0128a155;
    goto LAB_0128a543;
  }
  local_c8 = string_ptr + uVar3;
  bVar2 = local_c8[uVar8];
  if (9 < (byte)(bVar2 - 0x30)) {
    bVar1 = 1 < uVar4;
    uVar4 = uVar3;
    if (local_d8 < uVar3 || bVar1) goto LAB_0128a316;
    goto LAB_0128a543;
  }
  bVar1 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<short>,true,true>
                    (&local_e4,bVar2 - 0x30);
  if ((!bVar1) ||
     (((uVar6 = uVar7, ~uVar3 + string_size != uVar8 &&
       (uVar6 = uVar3 + 1, local_c8[uVar8 + 1] == '_')) &&
      (((string_size - uVar3) - 2 == uVar8 ||
       (uVar6 = uVar3 + 2, 9 < (byte)(local_c8[uVar8 + 2] - 0x30U))))))) goto LAB_0128a543;
  goto LAB_0128a187;
LAB_0128a316:
  if (4 < bVar2 - 9) {
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar4 == 1) || (uVar7 <= uVar4 + 1)) goto LAB_0128a543;
      exponent.result = 0;
      pcVar5 = string_ptr + uVar8 + uVar4 + 1;
      iVar9 = ~uVar8 + (string_size - uVar4);
      bVar1 = SUB41(bVar2 - 9,0);
      if (*pcVar5 == '-') {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                          (pcVar5,iVar9,&exponent,bVar1);
      }
      else {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                          (pcVar5,iVar9,&exponent,bVar1);
      }
      if (bVar1 == false) goto LAB_0128a543;
      bVar1 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,true>
                        (&local_e4,(int)exponent.result);
      goto LAB_0128a0b7;
    }
    if (bVar2 != 0x20) goto LAB_0128a543;
  }
  uVar6 = uVar4 + 1;
  uVar4 = uVar6;
  if (uVar6 < uVar7) {
    uVar4 = uVar7;
  }
  for (; uVar6 < uVar7; uVar6 = uVar6 + 1) {
    if ((0x20 < (ulong)(byte)string_ptr[uVar8 + uVar6]) ||
       ((0x100003e00U >> ((ulong)(byte)string_ptr[uVar8 + uVar6] & 0x3f) & 1) == 0))
    goto LAB_0128a543;
  }
LAB_0128a155:
  bVar1 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,true>(&local_e4);
  if ((bVar1) && (1 < uVar4)) goto LAB_0128a25c;
  goto LAB_0128a543;
LAB_0128a281:
  uVar3 = uVar7;
  if (uVar6 <= uVar3) {
    bVar1 = local_d8 < uVar4;
    uVar4 = uVar3;
    if (local_b8 < uVar3 || bVar1) goto LAB_0128a23f;
    goto LAB_0128a543;
  }
  local_c8 = string_ptr + uVar3;
  bVar2 = local_c8[uVar8];
  if (9 < (byte)(bVar2 - 0x30)) {
    bVar1 = local_d8 < uVar4;
    uVar4 = uVar3;
    if (local_b8 < uVar3 || bVar1) goto LAB_0128a36e;
    goto LAB_0128a543;
  }
  bVar1 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<short>,false,true>
                    (&local_e4,bVar2 - 0x30);
  if ((!bVar1) ||
     (((uVar7 = uVar6, ~uVar3 + string_size != uVar8 &&
       (uVar7 = uVar3 + 1, local_c8[uVar8 + 1] == '_')) &&
      (((string_size - uVar3) - 2 == uVar8 ||
       (uVar7 = uVar3 + 2, 9 < (byte)(local_c8[uVar8 + 2] - 0x30U))))))) goto LAB_0128a543;
  goto LAB_0128a281;
LAB_0128a36e:
  if (4 < bVar2 - 9) {
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar4 == local_d8) || (uVar6 <= uVar4 + 1)) goto LAB_0128a543;
      exponent.result = 0;
      pcVar5 = string_ptr + uVar8 + uVar4 + 1;
      iVar9 = ~uVar8 + (string_size - uVar4);
      bVar1 = SUB41(bVar2 - 9,0);
      if (*pcVar5 == '-') {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                          (pcVar5,iVar9,&exponent,bVar1);
      }
      else {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                          (pcVar5,iVar9,&exponent,bVar1);
      }
      if (bVar1 == false) goto LAB_0128a543;
      bVar1 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,false>
                        (&local_e4,(int)exponent.result);
LAB_0128a0b7:
      if (bVar1 != false) goto LAB_0128a25c;
      goto LAB_0128a543;
    }
    if (bVar2 != 0x20) goto LAB_0128a543;
  }
  uVar7 = uVar4 + 1;
  uVar4 = uVar7;
  if (uVar7 < uVar6) {
    uVar4 = uVar6;
  }
  for (; uVar7 < uVar6; uVar7 = uVar7 + 1) {
    if ((0x20 < (ulong)(byte)string_ptr[uVar8 + uVar7]) ||
       ((0x100003e00U >> ((ulong)(byte)string_ptr[uVar8 + uVar7] & 0x3f) & 1) == 0))
    goto LAB_0128a543;
  }
LAB_0128a23f:
  bVar1 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_e4);
  if ((bVar1) && (local_d8 < uVar4)) {
LAB_0128a25c:
    *result = local_e4.result;
    return true;
  }
  goto LAB_0128a543;
  while( true ) {
    bVar2 = string_ptr[uVar8 + uVar4];
    if (9 < (byte)(bVar2 - 0x30)) {
      if (bVar2 != 0x2c) goto LAB_0128a36e;
      local_b8 = uVar4 + 1;
      uVar7 = local_b8;
      goto LAB_0128a281;
    }
    bVar1 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<short>,false>
                      (&local_e4,bVar2 - 0x30);
    if ((!bVar1) ||
       (((uVar7 = uVar6, ~uVar4 + string_size != uVar8 &&
         (uVar7 = uVar4 + 1, string_ptr[uVar8 + 1 + uVar4] == '_')) &&
        (((string_size - uVar4) - 2 == uVar8 ||
         (uVar7 = uVar4 + 2, 9 < (byte)(string_ptr[uVar8 + 2 + uVar4] - 0x30U))))))) break;
LAB_0128a0d3:
    uVar4 = uVar7;
    if (uVar6 <= uVar4) goto LAB_0128a23f;
  }
LAB_0128a543:
  value.value.pointer.length = (uint32_t)string_size;
  if (value.value.pointer.length < 0xd) {
    value.value._12_4_ = 0;
    value.value._4_1_ = '\0';
    value.value._5_1_ = '\0';
    value.value._6_1_ = '\0';
    value.value._7_1_ = '\0';
    value.value._8_4_ = 0;
    value.value.pointer.ptr = (char *)0x0;
    if (value.value.pointer.length != 0) {
      switchD_01939fa4::default
                ((void *)((long)&value.value + 4),string_ptr,
                 (ulong)(value.value.pointer.length & 0xf));
      value.value.pointer.ptr = (char *)CONCAT44(value.value._12_4_,value.value._8_4_);
    }
  }
  else {
    value.value.pointer.prefix = (char  [4])*(undefined4 *)string_ptr;
    value.value.pointer.ptr = string_ptr;
  }
  ::std::__cxx11::string::string
            (local_50,"Could not convert string \"%s\" to DECIMAL(%d,%d)",&local_c9);
  string_t::GetString_abi_cxx11_(&local_70,&value);
  StringUtil::Format<std::__cxx11::string,int,int>
            ((string *)&exponent,(StringUtil *)local_50,&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(byte)local_c0,local_bc & 0xff,params_2);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string(local_50);
  HandleCastError::AssignError((string *)&exponent,parameters);
  ::std::__cxx11::string::~string((string *)&exponent);
  return false;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}